

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<tinyusdz::value::texcoord2f> * __thiscall
tinyusdz::Attribute::get_value<tinyusdz::value::texcoord2f>
          (optional<tinyusdz::value::texcoord2f> *__return_storage_ptr__,Attribute *this)

{
  optional<tinyusdz::value::texcoord2f> local_1c;
  
  primvar::PrimVar::get_value<tinyusdz::value::texcoord2f>(&local_1c,&this->_var);
  __return_storage_ptr__->has_value_ = local_1c.has_value_;
  if (local_1c.has_value_ == true) {
    __return_storage_ptr__->contained = local_1c.contained;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }